

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPrePartialsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  int iVar12;
  uint uVar13;
  float *pfVar14;
  ulong uVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  ulong uVar19;
  float *pfVar20;
  float *pfVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int local_a4;
  long local_a0;
  float *local_98;
  float *local_90;
  float *local_78;
  float *local_70;
  
  uVar1 = this->kStateCount;
  uVar19 = (ulong)uVar1;
  uVar13 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar13 = uVar1;
  }
  if ((long)this->kPartialsSize != 0) {
    memset(destP,0,(long)this->kPartialsSize << 2);
  }
  iVar2 = this->kCategoryCount;
  if (0 < (long)iVar2) {
    uVar7 = uVar1 + 1;
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->kPatternCount;
    iVar5 = this->kMatrixSize;
    local_a4 = iVar3 * startPattern;
    local_70 = matrices2 + 2;
    local_78 = matrices1 + 3;
    local_a0 = 0;
    local_98 = matrices1;
    local_90 = matrices2;
    do {
      if (startPattern < endPattern) {
        pfVar14 = destP + local_a4;
        pfVar18 = partials2 + local_a4;
        pfVar17 = partials1 + (iVar4 * (int)local_a0 + startPattern) * iVar3;
        iVar12 = startPattern;
        do {
          if (0 < (int)uVar1) {
            uVar15 = 0;
            pfVar11 = local_90;
            pfVar16 = local_78;
            pfVar20 = local_70;
            pfVar21 = local_98;
            do {
              auVar22 = ZEXT816(0) << 0x40;
              uVar8 = 0;
              if (3 < (int)uVar1) {
                do {
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = *(ulong *)(pfVar20 + (uVar8 - 2));
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = *(ulong *)(pfVar20 + uVar8);
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = *(ulong *)(pfVar18 + uVar8);
                  auVar22 = vfmadd213ps_fma(auVar27,auVar24,auVar22);
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = *(ulong *)(pfVar18 + uVar8 + 2);
                  auVar22 = vfmadd213ps_fma(auVar23,auVar26,auVar22);
                  uVar8 = uVar8 + 4;
                } while ((long)uVar8 < (long)(int)(uVar13 & 0xfffffffc));
              }
              auVar25 = ZEXT1664(auVar22);
              if ((int)uVar8 < (int)uVar1) {
                uVar8 = uVar8 & 0xffffffff;
                do {
                  auVar23 = vfmadd231ss_fma(auVar25._0_16_,ZEXT416((uint)pfVar11[uVar8]),
                                            ZEXT416((uint)pfVar18[uVar8]));
                  auVar25 = ZEXT1664(auVar23);
                  uVar8 = uVar8 + 1;
                } while (uVar19 != uVar8);
              }
              uVar8 = 0;
              auVar22 = vmovshdup_avx(auVar22);
              fVar6 = (auVar22._0_4_ + auVar25._0_4_) * pfVar17[uVar15];
              auVar22 = ZEXT416((uint)fVar6);
              pfVar10 = pfVar14;
              if (3 < (int)uVar1) {
                lVar9 = 0;
                uVar8 = 0;
                do {
                  auVar23 = vfmadd213ss_fma(ZEXT416((uint)pfVar16[uVar8 - 3]),ZEXT416((uint)fVar6),
                                            ZEXT416((uint)pfVar14[uVar8]));
                  pfVar14[uVar8] = auVar23._0_4_;
                  auVar23 = vfmadd213ss_fma(ZEXT416((uint)pfVar16[uVar8 - 2]),ZEXT416((uint)fVar6),
                                            ZEXT416((uint)pfVar14[uVar8 + 1]));
                  pfVar14[uVar8 + 1] = auVar23._0_4_;
                  auVar23 = vfmadd213ss_fma(ZEXT416((uint)pfVar16[uVar8 - 1]),auVar22,
                                            ZEXT416((uint)pfVar14[uVar8 + 2]));
                  pfVar14[uVar8 + 2] = auVar23._0_4_;
                  auVar23 = vfmadd213ss_fma(ZEXT416((uint)pfVar16[uVar8]),auVar22,
                                            ZEXT416((uint)pfVar14[uVar8 + 3]));
                  pfVar14[uVar8 + 3] = auVar23._0_4_;
                  uVar8 = uVar8 + 4;
                  lVar9 = lVar9 + 0x10;
                } while ((long)uVar8 < (long)(int)(uVar13 & 0xfffffffc));
                pfVar10 = (float *)(lVar9 + (long)pfVar14);
              }
              if ((int)uVar8 < (int)uVar1) {
                lVar9 = 0;
                do {
                  auVar23 = vfmadd213ss_fma(ZEXT416((uint)pfVar21[(uVar8 & 0xffffffff) + lVar9]),
                                            auVar22,ZEXT416((uint)pfVar10[lVar9]));
                  pfVar10[lVar9] = auVar23._0_4_;
                  lVar9 = lVar9 + 1;
                } while (uVar19 - (uVar8 & 0xffffffff) != lVar9);
              }
              uVar15 = uVar15 + 1;
              pfVar20 = pfVar20 + uVar7;
              pfVar11 = pfVar11 + uVar7;
              pfVar16 = pfVar16 + uVar7;
              pfVar21 = pfVar21 + uVar7;
            } while (uVar15 != uVar19);
          }
          pfVar14 = pfVar14 + iVar3;
          pfVar17 = pfVar17 + iVar3;
          iVar12 = iVar12 + 1;
          pfVar18 = pfVar18 + iVar3;
        } while (iVar12 != endPattern);
      }
      local_a0 = local_a0 + 1;
      local_a4 = local_a4 + iVar4 * iVar3;
      local_70 = local_70 + iVar5;
      local_90 = local_90 + iVar5;
      local_78 = local_78 + iVar5;
      local_98 = local_98 + iVar5;
    } while (local_a0 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                const REALTYPE* partials1,
                                                                const REALTYPE* matrices1,
                                                                const REALTYPE* partials2,
                                                                const REALTYPE* matrices2,
                                                                int startPattern,
                                                                int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum2A = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                // sum2A + sum2B = M_j P_j
                // Now 2nd loop
                tmpdestPtr = destPtr;
                REALTYPE  MjPj = (sum2A + sum2B) * partials1Ptr[i];

                for (j = 0; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }

}